

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall ft::list<int,_ft::allocator<int>_>::listInit(list<int,_ft::allocator<int>_> *this)

{
  listNode<int> *plVar1;
  node *pnVar2;
  
  pnVar2 = (node *)operator_new(0x18);
  this->m_head = pnVar2;
  pnVar2 = (node *)operator_new(0x18);
  this->m_tail = pnVar2;
  plVar1 = this->m_head;
  plVar1->data = 0;
  plVar1->prev = (listNode<int> *)0x0;
  pnVar2->data = 0;
  pnVar2->next = (listNode<int> *)0x0;
  plVar1->next = pnVar2;
  pnVar2->prev = plVar1;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}